

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3JoinType(Parse *pParse,Token *pA,Token *pB,Token *pC)

{
  uint uVar1;
  Token *pTVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  uchar uVar7;
  ulong uVar8;
  char *pcVar9;
  uchar uVar10;
  long lVar11;
  Token *apAll [3];
  Token *local_48 [3];
  
  local_48[0] = pA;
  local_48[1] = pB;
  local_48[2] = pC;
  lVar6 = 0;
  uVar3 = 0;
LAB_00148d0b:
  pTVar2 = local_48[lVar6];
  if (pTVar2 != (Token *)0x0) {
    uVar1 = pTVar2->n;
    lVar11 = 0;
    do {
      if ((uVar1 == sqlite3JoinType::aKeyword[lVar11].nChar) && (pTVar2->z != (char *)0x0)) {
        if (uVar1 == 0) goto LAB_00148da3;
        lVar4 = 0;
        uVar5 = uVar1 + 1;
        while (uVar8 = (ulong)(byte)pTVar2->z[lVar4], uVar8 != 0) {
          uVar10 = ""[uVar8];
          uVar7 = ""[(byte)"naturaleftouterightfullinnercross"
                           [(ulong)sqlite3JoinType::aKeyword[lVar11].i + lVar4]];
          if (uVar10 != uVar7) goto LAB_00148d8f;
          uVar5 = uVar5 - 1;
          lVar4 = lVar4 + 1;
          if (uVar5 < 2) goto LAB_00148da3;
        }
        uVar7 = ""[(byte)"naturaleftouterightfullinnercross"
                         [(ulong)sqlite3JoinType::aKeyword[lVar11].i + lVar4]];
        uVar10 = '\0';
LAB_00148d8f:
        if (uVar10 == uVar7) goto LAB_00148da3;
      }
      lVar11 = lVar11 + 1;
      if (lVar11 == 7) {
        uVar3 = uVar3 | 0x40;
        break;
      }
    } while( true );
  }
  goto LAB_00148dbd;
LAB_00148da3:
  uVar3 = uVar3 | sqlite3JoinType::aKeyword[lVar11].code;
  lVar6 = lVar6 + 1;
  if (lVar6 == 3) {
LAB_00148dbd:
    if ((~uVar3 & 0x21) == 0 || (uVar3 & 0x40) != 0) {
      if (pC == (Token *)0x0) {
        pcVar9 = "";
        pC = (Token *)0x0;
      }
      else {
        pcVar9 = " ";
      }
      sqlite3ErrorMsg(pParse,"unknown or unsupported join type: %T %T%s%T",pA,pB,pcVar9,pC);
    }
    else {
      if ((uVar3 & 0x18) == 8 || (uVar3 & 0x20) == 0) {
        return uVar3;
      }
      sqlite3ErrorMsg(pParse,"RIGHT and FULL OUTER JOINs are not currently supported");
    }
    return 1;
  }
  goto LAB_00148d0b;
}

Assistant:

SQLITE_PRIVATE int sqlite3JoinType(Parse *pParse, Token *pA, Token *pB, Token *pC){
  int jointype = 0;
  Token *apAll[3];
  Token *p;
                             /*   0123456789 123456789 123456789 123 */
  static const char zKeyText[] = "naturaleftouterightfullinnercross";
  static const struct {
    u8 i;        /* Beginning of keyword text in zKeyText[] */
    u8 nChar;    /* Length of the keyword in characters */
    u8 code;     /* Join type mask */
  } aKeyword[] = {
    /* natural */ { 0,  7, JT_NATURAL                },
    /* left    */ { 6,  4, JT_LEFT|JT_OUTER          },
    /* outer   */ { 10, 5, JT_OUTER                  },
    /* right   */ { 14, 5, JT_RIGHT|JT_OUTER         },
    /* full    */ { 19, 4, JT_LEFT|JT_RIGHT|JT_OUTER },
    /* inner   */ { 23, 5, JT_INNER                  },
    /* cross   */ { 28, 5, JT_INNER|JT_CROSS         },
  };
  int i, j;
  apAll[0] = pA;
  apAll[1] = pB;
  apAll[2] = pC;
  for(i=0; i<3 && apAll[i]; i++){
    p = apAll[i];
    for(j=0; j<ArraySize(aKeyword); j++){
      if( p->n==aKeyword[j].nChar 
          && sqlite3StrNICmp((char*)p->z, &zKeyText[aKeyword[j].i], p->n)==0 ){
        jointype |= aKeyword[j].code;
        break;
      }
    }
    testcase( j==0 || j==1 || j==2 || j==3 || j==4 || j==5 || j==6 );
    if( j>=ArraySize(aKeyword) ){
      jointype |= JT_ERROR;
      break;
    }
  }
  if(
     (jointype & (JT_INNER|JT_OUTER))==(JT_INNER|JT_OUTER) ||
     (jointype & JT_ERROR)!=0
  ){
    const char *zSp = " ";
    assert( pB!=0 );
    if( pC==0 ){ zSp++; }
    sqlite3ErrorMsg(pParse, "unknown or unsupported join type: "
       "%T %T%s%T", pA, pB, zSp, pC);
    jointype = JT_INNER;
  }else if( (jointype & JT_OUTER)!=0 
         && (jointype & (JT_LEFT|JT_RIGHT))!=JT_LEFT ){
    sqlite3ErrorMsg(pParse, 
      "RIGHT and FULL OUTER JOINs are not currently supported");
    jointype = JT_INNER;
  }
  return jointype;
}